

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::RunStatementInternal
          (ClientContext *this,ClientContextLock *lock,string *query,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,bool allow_stream_result,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          params,bool verify)

{
  pointer pPVar1;
  type lock_00;
  undefined7 in_register_00000081;
  undefined7 in_stack_00000009;
  undefined1 local_e0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined8 local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_b8;
  _Alloc_hider local_a8;
  undefined1 local_a0;
  ErrorData local_98;
  
  local_a8._M_p = (pointer)CONCAT71(in_stack_00000009,verify);
  local_a0 = SUB81(params.ptr,0);
  local_e0._8_8_ = *(long *)CONCAT71(in_register_00000081,allow_stream_result);
  *(long *)CONCAT71(in_register_00000081,allow_stream_result) = 0;
  PendingQueryInternal
            ((ClientContext *)local_e0,lock,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             query,(PendingQueryParameters *)(local_e0 + 8),SUB81(&local_a8,0));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_e0._8_8_)[1])();
  }
  local_e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pPVar1 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)local_e0);
  if ((pPVar1->super_BaseQueryResult).success == false) {
    pPVar1 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_e0);
    ErrorData::ErrorData(&local_98,&(pPVar1->super_BaseQueryResult).error);
    local_c8._M_pi = &local_b8;
    local_c0._0_1_ = (__atomic_base<bool>)0x0;
    local_c0._1_7_ = 0;
    local_b8._vptr__Sp_counted_base._0_1_ = 0;
    ErrorResult<duckdb::MaterializedQueryResult>
              ((ClientContext *)(local_e0 + 0x10),(ErrorData *)lock,(string *)&local_98);
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_e0._16_8_;
    local_e0._16_8_ = (element_type *)0x0;
    ::std::__cxx11::string::~string((string *)&local_c8);
    ErrorData::~ErrorData(&local_98);
  }
  else {
    lock_00 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              ::operator*((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_e0);
    PendingQueryResult::ExecuteInternal((PendingQueryResult *)this,(ClientContextLock *)lock_00);
  }
  if ((element_type *)local_e0._0_8_ != (element_type *)0x0) {
    (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                 &((BaseQueryResult *)local_e0._0_8_)->_vptr_BaseQueryResult)->internal).
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult>
ClientContext::RunStatementInternal(ClientContextLock &lock, const string &query, unique_ptr<SQLStatement> statement,
                                    bool allow_stream_result,
                                    optional_ptr<case_insensitive_map_t<BoundParameterData>> params, bool verify) {
	PendingQueryParameters parameters;
	parameters.allow_stream_result = allow_stream_result;
	parameters.parameters = params;
	auto pending = PendingQueryInternal(lock, std::move(statement), parameters, verify);
	if (pending->HasError()) {
		return ErrorResult<MaterializedQueryResult>(pending->GetErrorObject());
	}
	return ExecutePendingQueryInternal(lock, *pending);
}